

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-queue.h
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::ProducerConsumerQueue<unsigned_long>::pop(ProducerConsumerQueue<unsigned_long> *this)

{
  _List_node_base *value;
  _List_node_base *in_RSI;
  
  if ((((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&in_RSI->_M_next)->_M_impl).
      _M_node.super__List_node_base._M_next == in_RSI) {
    newAdaptedPromise<unsigned_long,kj::WaiterQueue<unsigned_long>::Node,kj::List<kj::WaiterQueue<unsigned_long>::BaseNode,&kj::WaiterQueue<unsigned_long>::BaseNode::link>&>
              ((kj *)this,
               (List<kj::WaiterQueue<unsigned_long>::BaseNode,_&kj::WaiterQueue<unsigned_long>::BaseNode::link>
                *)&in_RSI[1]._M_prev);
  }
  else {
    value = in_RSI->_M_prev[1]._M_next;
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI);
    Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,(FixVoid<unsigned_long>)value);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> pop() {
    // Eventually pop a value from the queue.
    // Note that if your sinks lag your sources, the promise will always be ready.

    if (!values.empty()) {
      // We have at least one value, get the oldest.
      KJ_IASSERT(waiters.empty());

      auto value = kj::mv(values.back());
      values.pop_back();
      return kj::mv(value);
    } else {
      // We don't have any values, add ourselves to the waiting queue.
      return waiters.wait();
    }
  }